

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

void __thiscall
helics::MessageTimeOperator::MessageTimeOperator
          (MessageTimeOperator *this,
          function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
          *userTimeFunction)

{
  function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  *in_RDI;
  function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_ffffffffffffffd8;
  
  FilterOperator::FilterOperator((FilterOperator *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__MessageTimeOperator_00a3fb58;
  std::function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  ::function(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

MessageTimeOperator::MessageTimeOperator(std::function<Time(Time)> userTimeFunction):
    TimeFunction(std::move(userTimeFunction))
{
}